

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall
fasttext::FastText::test(FastText *this,istream *in,int32_t k,real threshold,Meter *meter)

{
  int32_t hiddenSize;
  int32_t outputSize;
  int iVar1;
  double __x;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> line;
  Predictions predictions;
  State state;
  _Vector_base<int,_std::allocator<int>_> local_f8;
  _Vector_base<int,_std::allocator<int>_> local_d8;
  _Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> local_b8;
  Meter *local_98;
  State local_90;
  
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hiddenSize = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->dim;
  local_98 = meter;
  outputSize = Dictionary::nlabels((this->dict_).
                                   super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
  Model::State::State(&local_90,hiddenSize,outputSize,0);
  std::ios::clear((int)*(undefined8 *)(*(long *)in + -0x18) + (int)in);
  std::istream::seekg((long)in,_S_beg);
  while( true ) {
    iVar1 = std::istream::peek();
    if (iVar1 == -1) break;
    if (local_d8._M_impl.super__Vector_impl_data._M_finish !=
        local_d8._M_impl.super__Vector_impl_data._M_start) {
      local_d8._M_impl.super__Vector_impl_data._M_finish =
           local_d8._M_impl.super__Vector_impl_data._M_start;
    }
    if (local_f8._M_impl.super__Vector_impl_data._M_finish !=
        local_f8._M_impl.super__Vector_impl_data._M_start) {
      local_f8._M_impl.super__Vector_impl_data._M_finish =
           local_f8._M_impl.super__Vector_impl_data._M_start;
    }
    Dictionary::getLine((this->dict_).
                        super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        in,(vector<int,_std::allocator<int>_> *)&local_d8,
                        (vector<int,_std::allocator<int>_> *)&local_f8);
    if ((local_f8._M_impl.super__Vector_impl_data._M_start !=
         local_f8._M_impl.super__Vector_impl_data._M_finish) &&
       (local_d8._M_impl.super__Vector_impl_data._M_start !=
        local_d8._M_impl.super__Vector_impl_data._M_finish)) {
      if (local_b8._M_impl.super__Vector_impl_data._M_finish !=
          local_b8._M_impl.super__Vector_impl_data._M_start) {
        local_b8._M_impl.super__Vector_impl_data._M_finish =
             local_b8._M_impl.super__Vector_impl_data._M_start;
      }
      __x = (double)(ulong)(uint)threshold;
      predict(this,k,(vector<int,_std::allocator<int>_> *)&local_d8,(Predictions *)&local_b8,
              threshold);
      Meter::log(local_98,__x);
    }
  }
  Model::State::~State(&local_90);
  std::_Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::~_Vector_base
            (&local_b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_f8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_d8);
  return;
}

Assistant:

int32_t FastText::getSubwordId(const std::string& subword) const {
  int32_t h = dict_->hash(subword) % args_->bucket;
  return dict_->nwords() + h;
}